

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O1

_Bool Curl_uint_bset_first(uint_bset *bset,uint *pfirst)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  curl_uint64_t cVar5;
  _Bool _Var6;
  
  uVar1 = bset->nslots;
  uVar3 = 0xffffffff;
  _Var6 = uVar1 != 0;
  if (_Var6) {
    cVar5 = *bset->slots;
    uVar4 = 0;
    if (cVar5 == 0) {
      lVar2 = 0;
      uVar4 = 0;
      do {
        if (uVar1 - 1 == (int)lVar2) {
          _Var6 = false;
          goto LAB_00161bb4;
        }
        cVar5 = bset->slots[lVar2 + 1];
        uVar4 = uVar4 + 0x40;
        lVar2 = lVar2 + 1;
      } while (cVar5 == 0);
      _Var6 = (uint)lVar2 < uVar1;
    }
    lVar2 = 0;
    if (cVar5 != 0) {
      for (; (cVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar3 = (uint)lVar2 | uVar4;
  }
LAB_00161bb4:
  *pfirst = uVar3;
  return _Var6;
}

Assistant:

bool Curl_uint_bset_first(struct uint_bset *bset, unsigned int *pfirst)
{
  unsigned int i;
  for(i = 0; i < bset->nslots; ++i) {
    if(bset->slots[i]) {
      *pfirst = (i * 64) + CURL_CTZ64(bset->slots[i]);
      return TRUE;
    }
  }
  *pfirst = UINT_MAX; /* a value we cannot store */
  return FALSE;
}